

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

InstanceIsEqualToComparator * __thiscall
VectorInstance::op_count
          (VectorInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  bool bVar1;
  size_type sVar2;
  undefined8 *puVar3;
  shared_ptr<Instance> *rhs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  long in_RSI;
  InstanceIsEqualToComparator *in_RDI;
  iterator it;
  int count;
  shared_ptr<Instance> instance;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  InstanceIsEqualToComparator *this_00;
  int in_stack_ffffffffffffff5c;
  IntegerInstance *in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  __normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
  local_38;
  int local_2c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  
  this_00 = in_RDI;
  local_18 = in_RDX;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDX);
  if (sVar2 == 1) {
    rhs = (shared_ptr<Instance> *)(in_RSI + 0x58);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_18,0);
    get_shared_instance(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    local_2c = 0;
    local_38._M_current =
         (shared_ptr<Instance> *)
         std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::begin
                   ((vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                     *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
    while( true ) {
      std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::end
                ((vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_> *)
                 CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
                          *)rhs,(__normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
                                 *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
      ::operator*(&local_38);
      in_stack_ffffffffffffff1f =
           InstanceIsEqualToComparator::operator()(this_00,(shared_ptr<Instance> *)in_RDI,rhs);
      if ((bool)in_stack_ffffffffffffff1f) {
        local_2c = local_2c + 1;
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
      ::operator++((__normal_iterator<std::shared_ptr<Instance>_*,_std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>_>
                    *)in_RDI,(int)((ulong)rhs >> 0x20));
    }
    IntegerInstance::IntegerInstance(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    IntegerInstance::representation_abi_cxx11_
              ((IntegerInstance *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
    IntegerInstance::~IntegerInstance((IntegerInstance *)0x1bef66);
    std::shared_ptr<Instance>::~shared_ptr((shared_ptr<Instance> *)0x1bef73);
    return this_00;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = "RuntimeError: wrong number of arguments.";
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

std::string VectorInstance::op_count(const std::vector<std::string>& arguments) {
    if (arguments.size() != 1)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    std::shared_ptr<Instance> instance = get_shared_instance(_element_type, arguments[0]);
    int count = 0;
    for (auto it = _value.begin(); it != _value.end(); it++)
        if (InstanceIsEqualToComparator()(*it, instance))
            count++;
    return IntegerInstance(count).representation();
}